

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  char str [512];
  
  if ((((ssl->conf != (mbedtls_ssl_config *)0x0) && (X != (mbedtls_mpi *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    sVar3 = X->n;
    do {
      sVar8 = sVar3;
      sVar3 = sVar8 - 1;
      if (sVar3 == 0) break;
    } while (X->p[sVar3] == 0);
    uVar4 = 0x3f;
    while ((iVar2 = (int)uVar4, iVar7 = -1, -1 < iVar2 &&
           (iVar7 = iVar2, (X->p[sVar3] >> (uVar4 & 0x3f) & 1) == 0))) {
      uVar4 = (ulong)(iVar2 - 1);
    }
    snprintf(str,0x200,"value of \'%s\' (%d bits) is:\n",text,(ulong)((int)sVar3 * 0x40 + iVar7 + 1)
            );
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
    bVar1 = true;
    uVar9 = 0;
    lVar6 = 0;
    while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
      if ((bVar1) && (X->p[sVar8] == 0)) {
        bVar1 = true;
      }
      else {
        bVar5 = 0x38;
        for (iVar7 = 7; -1 < iVar7; iVar7 = iVar7 + -1) {
          if ((bVar1) && ((char)(X->p[sVar8] >> (bVar5 & 0x3f)) == '\0')) {
            bVar1 = true;
          }
          else {
            if (0 < (int)uVar9 && (uVar9 & 0xf) == 0) {
              snprintf(str + lVar6,0x200 - lVar6,anon_var_dwarf_3103f + 8);
              (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
              lVar6 = 0;
            }
            bVar1 = false;
            iVar2 = snprintf(str + lVar6,0x200 - lVar6," %02x",X->p[sVar8] >> (bVar5 & 0x3f) & 0xff)
            ;
            lVar6 = lVar6 + iVar2;
            uVar9 = uVar9 + 1;
          }
          bVar5 = bVar5 - 8;
        }
      }
    }
    if (bVar1) {
      iVar7 = snprintf(str + lVar6,0x200 - lVar6," 00");
      lVar6 = lVar6 + iVar7;
    }
    snprintf(str + lVar6,0x200 - lVar6,anon_var_dwarf_3103f + 8);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,str);
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_mpi *X )
{
    char str[DEBUG_BUF_SIZE];
    int j, k, zeros = 1;
    size_t i, n, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || X == NULL || level > debug_threshold )
        return;

    for( n = X->n - 1; n > 0; n-- )
        if( X->p[n] != 0 )
            break;

    for( j = ( sizeof(mbedtls_mpi_uint) << 3 ) - 1; j >= 0; j-- )
        if( ( ( X->p[n] >> j ) & 1 ) != 0 )
            break;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "value of '%s' (%d bits) is:\n",
              text, (int) ( ( n * ( sizeof(mbedtls_mpi_uint) << 3 ) ) + j + 1 ) );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    for( i = n + 1, j = 0; i > 0; i-- )
    {
        if( zeros && X->p[i - 1] == 0 )
            continue;

        for( k = sizeof( mbedtls_mpi_uint ) - 1; k >= 0; k-- )
        {
            if( zeros && ( ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF ) == 0 )
                continue;
            else
                zeros = 0;

            if( j % 16 == 0 )
            {
                if( j > 0 )
                {
                    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
                    debug_send_line( ssl, level, file, line, str );
                    idx = 0;
                }
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x", (unsigned int)
                             ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF );

            j++;
        }

    }

    if( zeros == 1 )
        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " 00" );

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
    debug_send_line( ssl, level, file, line, str );
}